

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* define_labelmap_abi_cxx11_(void)

{
  bool bVar1;
  istream *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string local_248 [8];
  string line;
  istream local_218 [8];
  ifstream myReadFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strVec;
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open((char *)local_218,0x1090ee);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI);
  std::__cxx11::string::string(local_248);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,(value_type *)local_248);
  }
  std::__cxx11::string::~string(local_248);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::vector<std::string> define_labelmap()
{

    ifstream myReadFile;
    myReadFile.open(objnames);
    std::vector<std::string> strVec;

    for( std::string line; getline( myReadFile, line ); )
        strVec.push_back(line);

    return strVec;
}